

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O0

bool __thiscall
MeCab::EncoderFeatureIndex::buildFeature(EncoderFeatureIndex *this,LearnerPath *path)

{
  bool bVar1;
  undefined1 uVar2;
  ostream *poVar3;
  char *pcVar4;
  pointer ppVar5;
  long *in_RSI;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_pair<const_int_*,_unsigned_long>_>_>::value,_pair<iterator,_bool>_>
  _Var6;
  iterator it_1;
  string key_1;
  iterator it;
  string key;
  string rfeature2;
  string lfeature2;
  string ufeature2;
  string rfeature1;
  string lfeature1;
  string ufeature1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
  *in_stack_fffffffffffffba8;
  StringBuffer *in_stack_fffffffffffffbb0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>
  *in_stack_fffffffffffffbb8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>
  *in_stack_fffffffffffffbc0;
  string *in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffcf0;
  string *in_stack_fffffffffffffcf8;
  ostream *in_stack_fffffffffffffd00;
  DictionaryRewriter *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  char *lfeature;
  allocator *rfeature;
  undefined4 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9c;
  die in_stack_fffffffffffffd9d;
  undefined1 in_stack_fffffffffffffd9e;
  byte bVar7;
  die in_stack_fffffffffffffd9f;
  FeatureIndex *in_stack_fffffffffffffda0;
  int local_24c;
  pair<const_int_*,_unsigned_long> local_248 [4];
  _Self local_208;
  _Self local_200;
  allocator local_1f1;
  string local_1f0 [32];
  _Base_ptr local_1d0;
  undefined1 local_1c8;
  int local_1bc;
  pair<const_int_*,_unsigned_long> local_1b8 [4];
  int local_174;
  _Self local_170;
  _Self local_168;
  allocator local_159;
  string local_158 [37];
  byte local_133;
  die local_132;
  allocator local_131;
  string local_130 [34];
  byte local_10e;
  die local_10d [20];
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  long *local_18;
  byte local_1;
  
  in_RSI[4] = 0;
  *(undefined8 *)(*in_RSI + 0x78) = 0;
  local_18 = in_RSI;
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::string(local_78);
  std::__cxx11::string::string(local_98);
  std::__cxx11::string::string(local_b8);
  std::__cxx11::string::string(local_d8);
  lfeature = *(char **)(local_18[2] + 0x40);
  rfeature = &local_f9;
  std::allocator<char>::allocator();
  local_10e = 0;
  std::__cxx11::string::string(local_f8,lfeature,rfeature);
  bVar1 = DictionaryRewriter::rewrite2
                    (in_stack_fffffffffffffd08,(string *)in_stack_fffffffffffffd00,
                     in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  if (!bVar1) {
    die::die(local_10d);
    local_10e = 1;
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x112);
    poVar3 = std::operator<<(poVar3,") [");
    poVar3 = std::operator<<(poVar3,
                             "rewrite_.rewrite2(path->lnode->feature, &ufeature1, &lfeature1, &rfeature1)"
                            );
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3," cannot rewrite pattern: ");
    poVar3 = std::operator<<(poVar3,*(char **)(local_18[2] + 0x40));
    die::operator&(local_10d,poVar3);
  }
  if ((local_10e & 1) != 0) {
    die::~die((die *)0x16c6c9);
  }
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  pcVar4 = *(char **)(*local_18 + 0x40);
  std::allocator<char>::allocator();
  local_133 = 0;
  std::__cxx11::string::string(local_130,pcVar4,&local_131);
  uVar2 = DictionaryRewriter::rewrite2
                    (in_stack_fffffffffffffd08,(string *)in_stack_fffffffffffffd00,
                     in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  if (!(bool)uVar2) {
    die::die(&local_132);
    local_133 = 1;
    in_stack_fffffffffffffd08 =
         (DictionaryRewriter *)
         std::operator<<((ostream *)&std::cerr,
                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                        );
    in_stack_fffffffffffffd00 = std::operator<<((ostream *)in_stack_fffffffffffffd08,"(");
    poVar3 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd00,0x119);
    poVar3 = std::operator<<(poVar3,") [");
    poVar3 = std::operator<<(poVar3,
                             "rewrite_.rewrite2(path->rnode->feature, &ufeature2, &lfeature2, &rfeature2)"
                            );
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3," cannot rewrite pattern: ");
    poVar3 = std::operator<<(poVar3,*(char **)(*local_18 + 0x40));
    die::operator&(&local_132,poVar3);
  }
  if ((local_133 & 1) != 0) {
    die::~die((die *)0x16c8d2);
  }
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  StringBuffer::clear((StringBuffer *)(in_RDI + 0x138));
  StringBuffer::operator<<(in_stack_fffffffffffffbb0,(string *)in_stack_fffffffffffffba8);
  StringBuffer::operator<<
            (in_stack_fffffffffffffbb0,(char)((ulong)in_stack_fffffffffffffba8 >> 0x38));
  StringBuffer::operator<<
            (in_stack_fffffffffffffbb0,(uchar)((ulong)in_stack_fffffffffffffba8 >> 0x38));
  StringBuffer::operator<<
            (in_stack_fffffffffffffbb0,(char)((ulong)in_stack_fffffffffffffba8 >> 0x38));
  pcVar4 = StringBuffer::str((StringBuffer *)(in_RDI + 0x138));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,pcVar4,&local_159);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  local_168._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
       ::find(in_stack_fffffffffffffba8,(key_type *)0x16c9f6);
  local_170._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
       ::end(in_stack_fffffffffffffba8);
  bVar1 = std::operator!=(&local_168,&local_170);
  if (bVar1) {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
                           *)0x16ca57);
    *(int **)(*local_18 + 0x88) = (ppVar5->second).first;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
                           *)0x16ca7a);
    (ppVar5->second).second = (ppVar5->second).second + 1;
LAB_0016cd1c:
    local_174 = 0;
  }
  else {
    std::__cxx11::string::c_str();
    bVar1 = FeatureIndex::buildUnigramFeature
                      ((FeatureIndex *)CONCAT17(uVar2,in_stack_fffffffffffffd10),
                       (LearnerPath *)in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00);
    if (bVar1) {
      local_1bc = 1;
      std::pair<const_int_*,_unsigned_long>::pair<const_int_*&,_int,_true>
                (local_1b8,(int **)(*local_18 + 0x88),&local_1bc);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>
      ::pair<std::pair<const_int_*,_unsigned_long>,_true>
                (in_stack_fffffffffffffbc0,&in_stack_fffffffffffffbb8->first,
                 (pair<const_int_*,_unsigned_long> *)in_stack_fffffffffffffbb0);
      _Var6 = std::
              map<std::__cxx11::string,std::pair<int_const*,unsigned_long>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>>>
              ::insert<std::pair<std::__cxx11::string,std::pair<int_const*,unsigned_long>>>
                        ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
                          *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      local_1d0 = (_Base_ptr)_Var6.first._M_node;
      local_1c8 = _Var6.second;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>
               *)0x16ccf4);
      goto LAB_0016cd1c;
    }
    local_1 = 0;
    local_174 = 1;
  }
  std::__cxx11::string::~string(local_158);
  if (local_174 != 0) goto LAB_0016d347;
  StringBuffer::clear((StringBuffer *)(in_RDI + 0x138));
  StringBuffer::operator<<(in_stack_fffffffffffffbb0,(string *)in_stack_fffffffffffffba8);
  StringBuffer::operator<<
            (in_stack_fffffffffffffbb0,(char)((ulong)in_stack_fffffffffffffba8 >> 0x38));
  StringBuffer::operator<<(in_stack_fffffffffffffbb0,(string *)in_stack_fffffffffffffba8);
  StringBuffer::operator<<
            (in_stack_fffffffffffffbb0,(char)((ulong)in_stack_fffffffffffffba8 >> 0x38));
  pcVar4 = StringBuffer::str((StringBuffer *)(in_RDI + 0x138));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,pcVar4,&local_1f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  local_200._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
       ::find(in_stack_fffffffffffffba8,(key_type *)0x16ce48);
  local_208._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
       ::end(in_stack_fffffffffffffba8);
  bVar1 = std::operator!=(&local_200,&local_208);
  if (bVar1) {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
                           *)0x16cea9);
    local_18[5] = (long)(ppVar5->second).first;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
                           *)0x16cec6);
    (ppVar5->second).second = (ppVar5->second).second + 1;
LAB_0016d078:
    local_174 = 0;
  }
  else {
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    bVar1 = FeatureIndex::buildBigramFeature
                      (in_stack_fffffffffffffda0,
                       (LearnerPath *)
                       CONCAT17(in_stack_fffffffffffffd9f,
                                CONCAT16(in_stack_fffffffffffffd9e,
                                         CONCAT15(in_stack_fffffffffffffd9d,
                                                  CONCAT14(in_stack_fffffffffffffd9c,
                                                           in_stack_fffffffffffffd98)))),
                       (char *)rfeature,lfeature);
    if (bVar1) {
      local_24c = 1;
      std::pair<const_int_*,_unsigned_long>::pair<const_int_*&,_int,_true>
                (local_248,(int **)(local_18 + 5),&local_24c);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::pair<const_int_*,_unsigned_long>,_true>
                (in_stack_fffffffffffffbc0,&in_stack_fffffffffffffbb8->first,
                 (pair<const_int_*,_unsigned_long> *)in_stack_fffffffffffffbb0);
      std::
      map<std::__cxx11::string,std::pair<int_const*,unsigned_long>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>>>
      ::insert<std::pair<std::__cxx11::string,std::pair<int_const*,unsigned_long>>>
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
                  *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>
               *)0x16d050);
      goto LAB_0016d078;
    }
    local_1 = 0;
    local_174 = 1;
  }
  std::__cxx11::string::~string(local_1f0);
  if (local_174 == 0) {
    bVar7 = 0;
    if (local_18[5] == 0) {
      die::die((die *)&stack0xfffffffffffffd9f);
      bVar7 = 1;
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x145);
      poVar3 = std::operator<<(poVar3,") [");
      poVar3 = std::operator<<(poVar3,"path->fvector");
      poVar3 = std::operator<<(poVar3,"] ");
      poVar3 = std::operator<<(poVar3," fvector is NULL");
      die::operator&((die *)&stack0xfffffffffffffd9f,poVar3);
    }
    if ((bVar7 & 1) != 0) {
      die::~die((die *)0x16d1ae);
    }
    bVar7 = 0;
    if (*(long *)(*local_18 + 0x88) == 0) {
      die::die((die *)&stack0xfffffffffffffd9d);
      bVar7 = 1;
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x146);
      poVar3 = std::operator<<(poVar3,") [");
      poVar3 = std::operator<<(poVar3,"path->rnode->fvector");
      poVar3 = std::operator<<(poVar3,"] ");
      poVar3 = std::operator<<(poVar3,"fevector is NULL");
      die::operator&((die *)&stack0xfffffffffffffd9d,poVar3);
    }
    if ((bVar7 & 1) != 0) {
      die::~die((die *)0x16d2bf);
    }
    local_1 = 1;
    local_174 = 1;
  }
LAB_0016d347:
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return (bool)(local_1 & 1);
}

Assistant:

bool EncoderFeatureIndex::buildFeature(LearnerPath *path) {
  path->rnode->wcost = path->cost = 0.0;

  std::string ufeature1;
  std::string lfeature1;
  std::string rfeature1;
  std::string ufeature2;
  std::string lfeature2;
  std::string rfeature2;

  CHECK_DIE(rewrite_.rewrite2(path->lnode->feature,
                              &ufeature1,
                              &lfeature1,
                              &rfeature1))
      << " cannot rewrite pattern: "
      << path->lnode->feature;

  CHECK_DIE(rewrite_.rewrite2(path->rnode->feature,
                              &ufeature2,
                              &lfeature2,
                              &rfeature2))
      << " cannot rewrite pattern: "
      << path->rnode->feature;

  {
    os_.clear();
    os_ << ufeature2 << ' ' << path->rnode->char_type << '\0';
    const std::string key(os_.str());
    std::map<std::string, std::pair<const int *, size_t> >::iterator
        it = feature_cache_.find(key);
    if (it != feature_cache_.end()) {
      path->rnode->fvector = it->second.first;
      it->second.second++;
    } else {
      if (!buildUnigramFeature(path, ufeature2.c_str())) {
        return false;
      }
      feature_cache_.insert(std::pair
                            <std::string, std::pair<const int *, size_t> >
                            (key,
                             std::pair<const int *, size_t>
                             (path->rnode->fvector, 1)));
    }
  }

  {
    os_.clear();
    os_ << rfeature1 << ' ' << lfeature2 << '\0';
    std::string key(os_.str());
    std::map<std::string, std::pair<const int *, size_t> >::iterator
        it = feature_cache_.find(key);
    if (it != feature_cache_.end()) {
      path->fvector = it->second.first;
      it->second.second++;
    } else {
      if (!buildBigramFeature(path, rfeature1.c_str(), lfeature2.c_str()))
        return false;
      feature_cache_.insert(std::pair
                            <std::string, std::pair<const int *, size_t> >
                            (key, std::pair<const int *, size_t>
                             (path->fvector, 1)));
    }
  }

  CHECK_DIE(path->fvector) << " fvector is NULL";
  CHECK_DIE(path->rnode->fvector) << "fevector is NULL";

  return true;
}